

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.h
# Opt level: O0

void GD::vec_add_multipredict<sparse_parameters>
               (multipredict_info<sparse_parameters> *mp,float fx,uint64_t fi)

{
  uint64_t uVar1;
  ulong i_00;
  weight *pwVar2;
  ulong in_RSI;
  ulong *in_RDI;
  float in_XMM0_Da;
  size_t c;
  uint64_t i;
  uint64_t top;
  polyprediction *p;
  uint64_t mask;
  ulong local_40;
  ulong local_38;
  sparse_parameters *this;
  
  if ((in_XMM0_Da <= -1e-10) || (1e-10 <= in_XMM0_Da)) {
    uVar1 = sparse_parameters::mask((sparse_parameters *)in_RDI[3]);
    this = (sparse_parameters *)in_RDI[2];
    local_38 = uVar1 & in_RSI;
    i_00 = local_38 + (*in_RDI - 1) * in_RDI[1];
    if (uVar1 < i_00) {
      for (local_40 = 0; local_40 < *in_RDI; local_40 = local_40 + 1) {
        pwVar2 = sparse_parameters::operator[](this,i_00);
        *(float *)&(this->_map)._M_h._M_buckets =
             in_XMM0_Da * *pwVar2 + *(float *)&(this->_map)._M_h._M_buckets;
        this = (sparse_parameters *)&(this->_map)._M_h._M_rehash_policy;
      }
    }
    else {
      for (; local_38 <= i_00; local_38 = in_RDI[1] + local_38) {
        pwVar2 = sparse_parameters::operator[](this,i_00);
        *(float *)&(this->_map)._M_h._M_buckets =
             in_XMM0_Da * *pwVar2 + *(float *)&(this->_map)._M_h._M_buckets;
        this = (sparse_parameters *)&(this->_map)._M_h._M_rehash_policy;
      }
    }
  }
  return;
}

Assistant:

inline void vec_add_multipredict(multipredict_info<T>& mp, const float fx, uint64_t fi)
{
  if ((-1e-10 < fx) && (fx < 1e-10))
    return;
  uint64_t mask = mp.weights.mask();
  polyprediction* p = mp.pred;
  fi &= mask;
  uint64_t top = fi + (uint64_t)((mp.count - 1) * mp.step);
  uint64_t i = 0;
  if (top <= mask)
  {
    i += fi;
    for (; i <= top; i += mp.step, ++p)
      p->scalar +=
          fx * mp.weights[i];  // TODO: figure out how to use weight_parameters::iterator (not using change_begin())
  }
  else  // TODO: this could be faster by unrolling into two loops
    for (size_t c = 0; c < mp.count; ++c, fi += (uint64_t)mp.step, ++p)
    {
      fi &= mask;
      p->scalar += fx * mp.weights[fi];
    }
}